

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

void outadefine(Global *global,DEFBUF *dp)

{
  byte bVar1;
  uint uVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  long in_RSI;
  char buffer [32];
  int i;
  int c;
  char *cp;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  char local_48 [20];
  int in_stack_ffffffffffffffcc;
  Global *in_stack_ffffffffffffffd0;
  int local_20;
  byte *local_18;
  
  Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (*(int *)(in_RSI + 0x18) < 1) {
    if (*(int *)(in_RSI + 0x18) == 0) {
      Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  else {
    Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffac);
    for (local_20 = 1; local_20 < *(int *)(in_RSI + 0x18); local_20 = local_20 + 1) {
      Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      Putint(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              in_stack_ffffffffffffffac);
    }
    Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    Putint(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_RSI + 8) != 0) {
    Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffac);
    local_18 = *(byte **)(in_RSI + 8);
    while( true ) {
      pbVar4 = local_18 + 1;
      bVar1 = *local_18;
      uVar2 = (uint)bVar1;
      if (uVar2 == 0) break;
      local_18 = pbVar4;
      if ((uVar2 < 0x7f) || (0x9e < uVar2)) {
        ppuVar3 = __ctype_b_loc();
        if ((((*ppuVar3)[(int)uVar2] & 0x4000) == 0) && ((uVar2 != 9 && (uVar2 != 10)))) {
          if (uVar2 == 0x1c) {
            Putchar((Global *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
            in_stack_ffffffffffffffb4 = uVar2;
          }
          else {
            in_stack_ffffffffffffffb4 = uVar2;
            if (uVar2 != 0x1d) {
              if (uVar2 == 0x1e) {
                Putstring((Global *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffb0),
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
                in_stack_ffffffffffffffb4 = uVar2;
              }
              else if (uVar2 == 0x1f) {
                Putchar((Global *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
                in_stack_ffffffffffffffb4 = uVar2;
              }
              else if (uVar2 != 0x9f) {
                sprintf(local_48,"\\0%o",(ulong)uVar2);
                Putstring((Global *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
                in_stack_ffffffffffffffb4 = uVar2;
              }
            }
          }
        }
        else {
          Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
        }
      }
      else {
        Putstring((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        Putint(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
    }
  }
  Putchar((Global *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
          in_stack_ffffffffffffffac);
  return;
}

Assistant:

void outadefine(struct Global *global, DEFBUF *dp)
{
  char *cp;
  int c;
  
  /* printf("#define %s", dp->name); */
  Putstring(global, "#define ");
  Putstring(global, dp->name);

  if (dp->nargs > 0) {
    int i;
    Putchar(global, '(');
    for (i = 1; i < dp->nargs; i++) {
      /* printf("__%d,", i); */
      Putstring(global, "__");
      Putint(global, i);
      Putchar(global, ',');
    }
    /* printf("__%d)", i); */
    Putstring(global, "__");
    Putint(global, i);
    Putchar(global, ')');

  } else if (dp->nargs == 0) {
    Putstring(global, "()");
  }
  if (dp->repl != NULL) {
    Putchar(global, '\t');
    for (cp = dp->repl; (c = *cp++ & 0xFF) != EOS;) {
      if (c >= MAC_PARM && c < (MAC_PARM + PAR_MAC)) {
	/* printf("__%d", c - MAC_PARM + 1); */
	Putstring(global, "__");
	Putint(global, c - MAC_PARM + 1);
      } else if (isprint(c) || c == '\t' || c == '\n')
	Putchar(global, c);
      else switch (c) {
      case QUOTE_PARM:
	Putchar(global, '#');
	break;
      case DEF_MAGIC: 	    /* Special anti-recursion */
      case MAC_PARM + PAR_MAC:    /* Special "arg" marker */
	break;
      case COM_SEP:
#if COMMENT_INVISIBLE
	Putstring(global, "/**/");
#else
	Putchar(global, ' ');
#endif
	break;
      case TOK_SEP:
	Putstring(global, "##");
	break;
      default:
	{
	  /* Octal output! */
	  char buffer[32];
	  sprintf(buffer, "\\0%o", c);
	  Putstring(global, buffer);
	}
      }
    }
  }
  Putchar(global, '\n');
}